

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O1

void __thiscall
cppcms::url_dispatcher::binder5<disp>::operator()
          (binder5<disp> *this,string *p1,string *p2,string *p3,string *p4,string *p5)

{
  disp *pdVar1;
  pointer pcVar2;
  code *pcVar3;
  application *paVar4;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pdVar1 = this->object;
  (**(code **)(*(long *)pdVar1 + 0x18))();
  pcVar3 = (code *)this->member;
  paVar4 = &this->object->super_application + *(long *)&this->field_0x8;
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *(long *)paVar4 + -1);
  }
  pcVar2 = (p1->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar2,pcVar2 + p1->_M_string_length)
  ;
  local_d0[0] = local_c0;
  pcVar2 = (p2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)local_d0,pcVar2,pcVar2 + p2->_M_string_length)
  ;
  pcVar2 = (p3->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,pcVar2,pcVar2 + p3->_M_string_length)
  ;
  pcVar2 = (p4->_M_dataplus)._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,pcVar2,pcVar2 + p4->_M_string_length)
  ;
  pcVar2 = (p5->_M_dataplus)._M_p;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,pcVar2,pcVar2 + p5->_M_string_length)
  ;
  (*pcVar3)(paVar4,local_50,local_d0,local_70,local_90,local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  (**(code **)(*(long *)pdVar1 + 0x20))();
  return;
}

Assistant:

void operator()(std::string p1,std::string p2,std::string p3,std::string p4,std::string p5) const
			{
				page_guard<C> guard(object);
				(object->*member)(p1,p2,p3,p4,p5);
			}